

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall psy::C::Lexer::lexUntilQuote(Lexer *this,SyntaxToken *tk,uchar quote,uint accLeng)

{
  int iVar1;
  CharacterConstant *pCVar3;
  uchar uVar4;
  uint size;
  char *s;
  char *pcVar2;
  
  pcVar2 = this->yytext_;
  s = pcVar2 + ~(ulong)accLeng;
  uVar4 = this->yychar_;
  if (uVar4 != quote) {
    do {
      if (uVar4 == '\\') {
        lexBackslash(this,tk->syntaxK_);
      }
      else {
        if ((uVar4 == '\0') || (uVar4 == '\n')) {
          iVar1 = *(int *)&this->yytext_ - (int)s;
          goto LAB_002b0ffc;
        }
        yyinput(this);
      }
      uVar4 = this->yychar_;
    } while (uVar4 != quote);
    pcVar2 = this->yytext_;
  }
  iVar1 = (int)pcVar2 - (int)s;
  yyinput(this);
LAB_002b0ffc:
  size = accLeng + iVar1 + 1;
  if (quote == '\'') {
    pCVar3 = SyntaxTree::findOrInsertCharacterConstant(this->tree_,s,size);
  }
  else {
    pCVar3 = (CharacterConstant *)SyntaxTree::findOrInsertStringLiteral(this->tree_,s,size);
  }
  (tk->field_10).character_ = pCVar3;
  return;
}

Assistant:

void Lexer::lexUntilQuote(SyntaxToken* tk, unsigned char quote, unsigned int accLeng)
{
    const char* yytext = yytext_ - 1;
    yytext -= accLeng;

    while (yychar_
               && yychar_ != quote
               && yychar_ != '\n') {
        if (yychar_ == '\\')
            lexBackslash(tk->syntaxK_);
        else
            yyinput();
    }

    int yyleng = yytext_ - yytext + 1;
    yyleng += accLeng;

    if (yychar_ == quote)
        yyinput();

    if (quote == '\'')
        tk->character_ = tree_->findOrInsertCharacterConstant(yytext, yyleng);
    else
        tk->string_ = tree_->findOrInsertStringLiteral(yytext, yyleng);
}